

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O3

void __thiscall StringReverser::handleToken(StringReverser *this,Token *token)

{
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  string value;
  long *local_a0;
  long local_98;
  long local_90 [2];
  Token local_80;
  
  if (token->type != tt_string) {
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    return;
  }
  pcVar1 = (token->value)._M_dataplus._M_p;
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (token->value)._M_string_length);
  plVar5 = (long *)((long)local_a0 + local_98 + -1);
  plVar2 = local_a0;
  if (local_a0 < plVar5 && local_98 != 0) {
    do {
      plVar4 = (long *)((long)plVar2 + 1);
      lVar3 = *plVar2;
      *(char *)plVar2 = (char)*plVar5;
      *(char *)plVar5 = (char)lVar3;
      plVar5 = (long *)((long)plVar5 + -1);
      plVar2 = plVar4;
    } while (plVar4 < plVar5);
  }
  QPDFTokenizer::Token::Token(&local_80,tt_string,(string *)&local_a0);
  QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.error_message._M_dataplus._M_p != &local_80.error_message.field_2) {
    operator_delete(local_80.error_message._M_dataplus._M_p,
                    local_80.error_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.raw_value._M_dataplus._M_p != &local_80.raw_value.field_2) {
    operator_delete(local_80.raw_value._M_dataplus._M_p,
                    local_80.raw_value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.value._M_dataplus._M_p != &local_80.value.field_2) {
    operator_delete(local_80.value._M_dataplus._M_p,local_80.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  return;
}

Assistant:

void
StringReverser::handleToken(QPDFTokenizer::Token const& token)
{
    // For string tokens, reverse the characters. For other tokens, just pass them through. Notice
    // that we construct a new string token and write that, thus allowing the library to handle any
    // subtleties about properly encoding unprintable characters. This function doesn't handle
    // multibyte characters at all. It's not intended to be an example of the correct way to reverse
    // strings. It's just intended to give a simple example of a pretty minimal filter and to show
    // an example of writing a constructed token.
    if (token.getType() == QPDFTokenizer::tt_string) {
        std::string value = token.getValue();
        std::reverse(value.begin(), value.end());
        writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, value));
    } else {
        writeToken(token);
    }
}